

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::reserve
          (vector<double,_pstd::pmr::polymorphic_allocator<double>_> *this,size_t n)

{
  memory_resource *pmVar1;
  size_t sVar2;
  double *pdVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t sVar6;
  double *pdVar5;
  
  if (this->nAlloc < n) {
    if (n * 8 == 0) {
      pdVar5 = (double *)0x0;
    }
    else {
      pmVar1 = (this->alloc).memoryResource;
      iVar4 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,n * 8,8);
      pdVar5 = (double *)CONCAT44(extraout_var,iVar4);
    }
    sVar2 = this->nStored;
    if (sVar2 != 0) {
      pdVar3 = this->ptr;
      sVar6 = 0;
      do {
        pdVar5[sVar6] = pdVar3[sVar6];
        sVar6 = sVar6 + 1;
      } while (sVar2 != sVar6);
    }
    if (this->ptr != (double *)0x0) {
      pmVar1 = (this->alloc).memoryResource;
      (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,this->nAlloc << 3,8);
    }
    this->nAlloc = n;
    this->ptr = pdVar5;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }